

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fees.cpp
# Opt level: O0

CFeeRate wallet::GetDiscardRate(CWallet *wallet)

{
  long lVar1;
  bool bVar2;
  undefined4 uVar3;
  Chain *pCVar4;
  CWallet *this;
  CFeeRate *pCVar5;
  long in_RDI;
  long in_FS_OFFSET;
  uint highest_target;
  CFeeRate discard_rate;
  CFeeRate *in_stack_ffffffffffffffb8;
  CFeeRate *in_stack_ffffffffffffffc0;
  CWallet *in_stack_ffffffffffffffc8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pCVar4 = CWallet::chain(in_stack_ffffffffffffffc8);
  uVar3 = (**(code **)(*(long *)pCVar4 + 0xe0))();
  pCVar4 = CWallet::chain(in_stack_ffffffffffffffc8);
  (**(code **)(*(long *)pCVar4 + 0xd8))(pCVar4,uVar3,0,0);
  CFeeRate::CFeeRate<int>(in_stack_ffffffffffffffb8,0);
  bVar2 = ::operator==((CFeeRate *)in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  if (bVar2) {
    this = (CWallet *)(in_RDI + 0x3a8);
  }
  else {
    this = (CWallet *)std::min<CFeeRate>(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  }
  pCVar4 = CWallet::chain(this);
  (**(code **)(*(long *)pCVar4 + 0x100))();
  pCVar5 = std::max<CFeeRate>(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (CFeeRate)pCVar5->nSatoshisPerK;
  }
  __stack_chk_fail();
}

Assistant:

CFeeRate GetDiscardRate(const CWallet& wallet)
{
    unsigned int highest_target = wallet.chain().estimateMaxBlocks();
    CFeeRate discard_rate = wallet.chain().estimateSmartFee(highest_target, /*conservative=*/false);
    // Don't let discard_rate be greater than longest possible fee estimate if we get a valid fee estimate
    discard_rate = (discard_rate == CFeeRate(0)) ? wallet.m_discard_rate : std::min(discard_rate, wallet.m_discard_rate);
    // Discard rate must be at least dust relay feerate
    discard_rate = std::max(discard_rate, wallet.chain().relayDustFee());
    return discard_rate;
}